

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::ProcessValidTx
          (PeerManagerImpl *this,NodeId nodeid,CTransactionRef *tx,
          list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *replaced_transactions)

{
  element_type *peVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  size_t sVar4;
  const_iterator __end1;
  _List_node_base *p_Var5;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  unsigned_long *in_stack_fffffffffffffeb0;
  ulong local_138;
  undefined1 local_130 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f8 [3];
  undefined8 local_98;
  char *pcStack_90;
  string local_78;
  char *local_58;
  size_t local_50;
  char local_48;
  undefined7 uStack_47;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_130._8_8_ = nodeid;
  TxRequestTracker::ForgetTxHash
            (&this->m_txrequest,
             &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              hash).m_wrapped);
  TxRequestTracker::ForgetTxHash
            (&this->m_txrequest,
             &(((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_witness_hash).m_wrapped);
  TxOrphanage::AddChildrenToWorkSet
            (&this->m_orphanage,
             (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  TxOrphanage::EraseTx
            (&this->m_orphanage,
             &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              m_witness_hash);
  pLVar3 = LogInstance();
  bVar2 = BCLog::Logger::WillLogCategoryLevel(pLVar3,MEMPOOL,Debug);
  if (bVar2) {
    base_blob<256u>::ToString_abi_cxx11_
              (local_f8,&((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->hash);
    base_blob<256u>::ToString_abi_cxx11_
              ((string *)(local_130 + 0x18),
               &((tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    local_130._0_8_ = CTxMemPool::size(this->m_mempool);
    sVar4 = CTxMemPool::DynamicMemoryUsage(this->m_mempool);
    local_138 = sVar4 / 1000;
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar3);
    if (bVar2) {
      local_50 = 0;
      local_48 = '\0';
      local_58 = &local_48;
      tinyformat::format<long,std::__cxx11::string,std::__cxx11::string,unsigned_long,unsigned_long>
                (&local_78,
                 (tinyformat *)
                 "AcceptToMemoryPool: peer=%d: accepted %s (wtxid=%s) (poolsz %u txn, %u kB)\n",
                 local_130 + 8,(long *)local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_130 + 0x18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                 &local_138,in_stack_fffffffffffffeb0);
      _GLOBAL__N_1::PeerManagerImpl::ProcessValidTx();
      pLVar3 = LogInstance();
      local_98 = 0x5b;
      pcStack_90 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp";
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x5b;
      str._M_str = local_58;
      str._M_len = local_50;
      logging_function._M_str = "ProcessValidTx";
      logging_function._M_len = 0xe;
      BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0xce0,MEMPOOL,Debug);
      if (local_58 != &local_48) {
        operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._24_8_ != &local_108) {
      operator_delete((void *)local_130._24_8_,local_108._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8[0]._M_dataplus._M_p != &local_f8[0].field_2) {
      operator_delete(local_f8[0]._M_dataplus._M_p,local_f8[0].field_2._M_allocated_capacity + 1);
    }
  }
  peVar1 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  RelayTransaction(this,&(peVar1->hash).m_wrapped,&(peVar1->m_witness_hash).m_wrapped);
  for (p_Var5 = (replaced_transactions->
                super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var5 != (_List_node_base *)replaced_transactions;
      p_Var5 = (((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    AddToCompactExtraTransactions(this,(CTransactionRef *)(p_Var5 + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::ProcessValidTx(NodeId nodeid, const CTransactionRef& tx, const std::list<CTransactionRef>& replaced_transactions)
{
    AssertLockNotHeld(m_peer_mutex);
    AssertLockHeld(g_msgproc_mutex);
    AssertLockHeld(m_tx_download_mutex);

    // As this version of the transaction was acceptable, we can forget about any requests for it.
    // No-op if the tx is not in txrequest.
    m_txrequest.ForgetTxHash(tx->GetHash());
    m_txrequest.ForgetTxHash(tx->GetWitnessHash());

    m_orphanage.AddChildrenToWorkSet(*tx);
    // If it came from the orphanage, remove it. No-op if the tx is not in txorphanage.
    m_orphanage.EraseTx(tx->GetWitnessHash());

    LogDebug(BCLog::MEMPOOL, "AcceptToMemoryPool: peer=%d: accepted %s (wtxid=%s) (poolsz %u txn, %u kB)\n",
             nodeid,
             tx->GetHash().ToString(),
             tx->GetWitnessHash().ToString(),
             m_mempool.size(), m_mempool.DynamicMemoryUsage() / 1000);

    RelayTransaction(tx->GetHash(), tx->GetWitnessHash());

    for (const CTransactionRef& removedTx : replaced_transactions) {
        AddToCompactExtraTransactions(removedTx);
    }
}